

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Chapters::ExpandChaptersArray(Chapters *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  Chapter *pCVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  ulong *puVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  
  iVar3 = this->chapters_size_;
  uVar4 = this->chapters_count_;
  if ((int)uVar4 < iVar3) {
    return true;
  }
  iVar10 = 1;
  if (iVar3 != 0) {
    iVar10 = iVar3 * 2;
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)iVar10;
  uVar11 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0x30),8) == 0) {
    uVar11 = SUB168(auVar6 * ZEXT816(0x30),0) | 8;
  }
  puVar8 = (ulong *)operator_new__(uVar11,(nothrow_t *)&std::nothrow);
  if (puVar8 == (ulong *)0x0) {
    return false;
  }
  *puVar8 = (long)iVar10;
  pCVar5 = this->chapters_;
  if ((int)uVar4 < 1) {
    if (pCVar5 == (Chapter *)0x0) goto LAB_0011d791;
  }
  else {
    lVar9 = 0;
    do {
      *(undefined8 *)((long)puVar8 + lVar9 + 8) = *(undefined8 *)((long)&pCVar5->id_ + lVar9);
      puVar1 = (undefined8 *)((long)&pCVar5->start_timecode_ + lVar9);
      uVar7 = puVar1[1];
      puVar2 = (undefined8 *)((long)puVar8 + lVar9 + 0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar7;
      *(undefined8 *)((long)puVar8 + lVar9 + 0x20) = *(undefined8 *)((long)&pCVar5->uid_ + lVar9);
      *(undefined8 *)((long)puVar8 + lVar9 + 0x28) =
           *(undefined8 *)((long)&pCVar5->displays_ + lVar9);
      *(undefined8 *)((long)puVar8 + lVar9 + 0x30) =
           *(undefined8 *)((long)&pCVar5->displays_size_ + lVar9);
      lVar9 = lVar9 + 0x30;
    } while ((ulong)uVar4 * 0x30 != lVar9);
  }
  operator_delete__(&pCVar5[-1].displays_size_);
LAB_0011d791:
  this->chapters_ = (Chapter *)(puVar8 + 1);
  this->chapters_size_ = iVar10;
  return true;
}

Assistant:

bool Chapters::ExpandChaptersArray() {
  if (chapters_size_ > chapters_count_)
    return true;  // nothing to do yet

  const int size = (chapters_size_ == 0) ? 1 : 2 * chapters_size_;

  Chapter* const chapters = new (std::nothrow) Chapter[size];  // NOLINT
  if (chapters == NULL)
    return false;

  for (int idx = 0; idx < chapters_count_; ++idx) {
    const Chapter& src = chapters_[idx];
    Chapter* const dst = chapters + idx;
    src.ShallowCopy(dst);
  }

  delete[] chapters_;

  chapters_ = chapters;
  chapters_size_ = size;

  return true;
}